

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall ON_Annotation::ON_Annotation(ON_Annotation *this,ON_Annotation *src)

{
  uchar *puVar1;
  undefined8 uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_UUID *pOVar10;
  long lVar11;
  ON_Plane *pOVar12;
  ON_Plane *pOVar13;
  byte bVar14;
  
  bVar14 = 0;
  ON_Object::ON_Object((ON_Object *)this,(ON_Object *)src);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00809050;
  this->m_annotation_type = Unset;
  this->m_allow_text_scaling = true;
  this->m_reserved2 = '\0';
  this->m_reserved3 = '\0';
  this->m_reserved4 = 0;
  pOVar10 = ON_ModelComponent::Id(&ON_DimStyle::Default.super_ON_ModelComponent);
  uVar3 = pOVar10->Data2;
  uVar4 = pOVar10->Data3;
  uVar2 = *(undefined8 *)pOVar10->Data4;
  (this->m_dimstyle_id).Data1 = pOVar10->Data1;
  (this->m_dimstyle_id).Data2 = uVar3;
  (this->m_dimstyle_id).Data3 = uVar4;
  *(undefined8 *)(this->m_dimstyle_id).Data4 = uVar2;
  pOVar12 = &ON_Plane::World_xy;
  pOVar13 = &this->m_plane;
  for (lVar11 = 0x10; dVar5 = ON_2dVector::XAxis.y, lVar11 != 0; lVar11 = lVar11 + -1) {
    (pOVar13->origin).x = (pOVar12->origin).x;
    pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar14 * -2 + 1) * 8);
    pOVar13 = (ON_Plane *)((long)pOVar13 + (ulong)bVar14 * -0x10 + 8);
  }
  (this->m_horizontal_direction).x = ON_2dVector::XAxis.x;
  (this->m_horizontal_direction).y = dVar5;
  this->m_text = (ON_TextContent *)0x0;
  this->m_override_dimstyle = (ON_DimStyle *)0x0;
  this->m_parent_dimstyle_content_version_number = 0;
  (this->m_bbox_cache).m_count = 0;
  (this->m_bbox_cache).m_capacity = 0;
  lVar11 = 0x108;
  do {
    dVar9 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
    dVar8 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
    dVar7 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
    dVar6 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
    dVar5 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
    puVar1 = (this->m_dimstyle_id).Data4 + lVar11 + -0x30;
    *(double *)puVar1 = ON_BoundingBox::UnsetBoundingBox.m_max.y;
    *(double *)(puVar1 + 8) = dVar9;
    puVar1 = (this->m_dimstyle_id).Data4 + lVar11 + -0x40;
    *(double *)puVar1 = dVar7;
    *(double *)(puVar1 + 8) = dVar8;
    puVar1 = (this->m_dimstyle_id).Data4 + lVar11 + -0x50;
    *(double *)puVar1 = dVar5;
    *(double *)(puVar1 + 8) = dVar6;
    uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    puVar1 = (this->m_dimstyle_id).Data4 + lVar11 + -0x20;
    *(undefined8 *)puVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)(puVar1 + 8) = uVar2;
    *(undefined4 *)((this->m_dimstyle_id).Data4 + lVar11 + -0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    lVar11 = lVar11 + 0x48;
  } while (lVar11 != 0x348);
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Annotation::ON_Annotation(const ON_Annotation& src)
  : ON_Geometry(src)
{
  Internal_CopyFrom(src);
}